

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileImmutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file)

{
  string *this_00;
  bool bVar1;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
  *in_RCX;
  ClassNameResolver *pCVar2;
  string_view classname;
  FileDescriptor *local_58;
  undefined1 local_50 [40];
  
  pCVar2 = (ClassNameResolver *)&this->file_immutable_outer_class_names_;
  local_58 = file;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
  ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_50,pCVar2,&local_58);
  if (*(long *)(local_50._8_8_ + 0x10) == 0) {
    this_00 = (string *)(local_50._8_8_ + 8);
    if ((*(byte *)((long)&local_58->options_->field_0 + 0x18) & 2) == 0) {
      GetFileDefaultImmutableClassName_abi_cxx11_((string *)local_50,pCVar2,local_58);
      std::__cxx11::string::operator=(this_00,(string *)local_50);
      if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
      pCVar2 = (ClassNameResolver *)local_50;
      protobuf::internal::InternalFeatureHelper::
      GetResolvedFeatureExtension<google::protobuf::FileDescriptor,pb::JavaFeatures,(unsigned_char)11,false>
                ((JavaFeatures *)pCVar2,(InternalFeatureHelper *)local_58,
                 (FileDescriptor *)&pb::java,in_RCX);
      pb::JavaFeatures::~JavaFeatures((JavaFeatures *)pCVar2);
      if (local_50[0x1e] == '\x01') {
        classname._M_str = *(char **)(local_50._8_8_ + 8);
        classname._M_len = *(size_t *)(local_50._8_8_ + 0x10);
        bVar1 = HasConflictingClassName(pCVar2,local_58,classname,EXACT_EQUAL);
        if (bVar1) {
          std::__cxx11::string::append((char *)this_00);
        }
      }
    }
    else {
      std::__cxx11::string::_M_assign(this_00);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(local_50._8_8_ + 8),
             *(long *)(local_50._8_8_ + 0x10) + *(long *)(local_50._8_8_ + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetFileImmutableClassName(
    const FileDescriptor* file) {
  std::string& class_name = file_immutable_outer_class_names_[file];
  if (class_name.empty()) {
    if (file->options().has_java_outer_classname()) {
      class_name = file->options().java_outer_classname();
    } else {
      class_name = GetFileDefaultImmutableClassName(file);

      // This disambiguation logic is deprecated and only enabled when using
      // the old default scheme.
      if (UseOldFileClassNameDefault(file) &&
          HasConflictingClassName(file, class_name,
                                  NameEquality::EXACT_EQUAL)) {
        class_name += kOuterClassNameSuffix;
      }
    }
  }
  return class_name;
}